

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopThread.cpp
# Opt level: O1

void __thiscall EventLoopThread::EventLoopThread(EventLoopThread *this)

{
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  string local_30;
  
  this->loop_ = (EventLoop *)0x0;
  this->exiting_ = false;
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_58._M_unused._M_object = operator_new(0x18);
  *(code **)local_58._M_unused._0_8_ = threadFunc;
  *(undefined8 *)((long)local_58._M_unused._0_8_ + 8) = 0;
  *(EventLoopThread **)((long)local_58._M_unused._0_8_ + 0x10) = this;
  pcStack_40 = std::
               _Function_handler<void_(),_std::_Bind<void_(EventLoopThread::*(EventLoopThread_*))()>_>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(),_std::_Bind<void_(EventLoopThread::*(EventLoopThread_*))()>_>
             ::_M_manager;
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"EventLoopThread","");
  Thread::Thread(&this->thread_,(ThreadFunc *)&local_58,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  pthread_mutex_init((pthread_mutex_t *)&this->mutex_,(pthread_mutexattr_t *)0x0);
  (this->cond_).mutex = &this->mutex_;
  pthread_cond_init((pthread_cond_t *)&(this->cond_).cond,(pthread_condattr_t *)0x0);
  return;
}

Assistant:

EventLoopThread::EventLoopThread()
        : loop_(nullptr),
        exiting_(false),
        thread_(bind(&EventLoopThread::threadFunc, this), "EventLoopThread"),
        mutex_(),
        cond_(mutex_) {  }